

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::generateRSA
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  ulong uVar1;
  _func_int **pp_Var2;
  char cVar3;
  byte bVar4;
  int iVar5;
  Session *this_00;
  Token *this_01;
  CryptoFactory *pCVar6;
  undefined4 extraout_var;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  char *pcVar10;
  ulong uVar11;
  ByteString *pBVar12;
  CK_ULONG CVar13;
  CK_ULONG CVar14;
  long *plVar15;
  CK_ATTRIBUTE_PTR p_Var16;
  size_t inBitLen;
  CK_RV CVar17;
  unsigned_long *puVar18;
  bool bVar19;
  ByteString publicExponent;
  ByteString modulus;
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  ByteString coefficient;
  ByteString exponent2;
  ByteString exponent1;
  ByteString prime2;
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  ByteString exponent;
  RSAParameters p;
  CK_ATTRIBUTE publicKeyAttribs [32];
  long *local_5b8;
  CK_ULONG local_5b0;
  OSAttribute local_5a8;
  long *local_508;
  CK_SESSION_HANDLE local_500;
  CK_ULONG local_4f8;
  ByteString local_4f0;
  ByteString local_4c8;
  CK_ATTRIBUTE_PTR local_4a0;
  ByteString local_498;
  ByteString local_470;
  ByteString local_448;
  ByteString local_420;
  ByteString local_3f8;
  ByteString local_3d0;
  undefined1 local_3a8 [16];
  ByteString local_398;
  RSAParameters local_370;
  ByteString local_338;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  ByteString *local_2e8;
  undefined8 local_2e0;
  
  *phPublicKey = 0;
  *phPrivateKey = 0;
  local_4f8 = ulPublicKeyAttributeCount;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  this_01 = Session::getToken(this_00);
  if (this_01 == (Token *)0x0) {
    return 5;
  }
  local_5b0 = ulPrivateKeyAttributeCount;
  local_500 = hSession;
  ByteString::ByteString(&local_398,"010001");
  if (local_4f8 != 0) {
    puVar18 = &pPublicKeyTemplate->ulValueLen;
    inBitLen = 0;
    CVar14 = local_4f8;
    local_4a0 = pPrivateKeyTemplate;
    do {
      if (((_CK_ATTRIBUTE *)(puVar18 + -2))->type == 0x122) {
        ByteString::ByteString(&local_338,(uchar *)puVar18[-1],*puVar18);
        ByteString::operator=(&local_398,&local_338);
        local_338._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_338.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
      else if (((_CK_ATTRIBUTE *)(puVar18 + -2))->type == 0x121) {
        if (*puVar18 != 8) {
          CVar17 = 0x13;
          softHSMLog(6,"generateRSA",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x20de,"CKA_MODULUS_BITS does not have the size of CK_ULONG");
          goto LAB_0013c041;
        }
        inBitLen = *(size_t *)puVar18[-1];
      }
      puVar18 = puVar18 + 3;
      CVar14 = CVar14 - 1;
    } while (CVar14 != 0);
    if (inBitLen != 0) {
      local_370.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
           (Serialisable)&PTR_serialise_0019bb30;
      ByteString::ByteString(&local_370.e);
      local_370.bitLen = 0;
      RSAParameters::setE(&local_370,&local_398);
      RSAParameters::setBitLength(&local_370,inBitLen);
      local_5b8 = (long *)0x0;
      pCVar6 = CryptoFactory::i();
      iVar5 = (*pCVar6->_vptr_CryptoFactory[2])(pCVar6,1);
      plVar8 = (long *)CONCAT44(extraout_var,iVar5);
      CVar17 = 5;
      if (plVar8 != (long *)0x0) {
        cVar3 = (**(code **)(*plVar8 + 0x60))(plVar8,&local_5b8,&local_370,0);
        if (cVar3 == '\0') {
          softHSMLog(3,"generateRSA",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x20fd,"Could not generate key pair");
          pCVar6 = CryptoFactory::i();
          (*pCVar6->_vptr_CryptoFactory[3])(pCVar6,plVar8);
        }
        else {
          local_508 = (long *)(**(code **)(*local_5b8 + 0x18))();
          plVar7 = (long *)(**(code **)(*local_5b8 + 0x28))();
          local_470._vptr_ByteString = (_func_int **)0x2;
          local_498._vptr_ByteString = (_func_int **)0x0;
          memset(&local_338,0,0x300);
          local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x8;
          local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
          local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = &isPublicKeyOnToken;
          local_310 = 1;
          local_308 = 2;
          local_300 = &isPublicKeyPrivate;
          local_2f8 = 1;
          local_2f0 = 0x100;
          local_2e0 = 8;
          CVar17 = 0xd1;
          local_338.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
          _M_impl.super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&local_470;
          local_2e8 = &local_498;
          if (local_4f8 < 0x1d) {
            uVar11 = 1;
            CVar14 = 4;
            do {
              uVar1 = pPublicKeyTemplate->type;
              CVar13 = CVar14;
              if (((2 < uVar1) && (uVar1 != 0x100)) && (uVar1 != 0x122)) {
                CVar13 = CVar14 + 1;
                (&local_338.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data)[CVar14]._M_start =
                     (pointer)pPublicKeyTemplate->ulValueLen;
                pp_Var2 = (_func_int **)pPublicKeyTemplate->pValue;
                (&local_338._vptr_ByteString)[CVar14 * 3] = (_func_int **)pPublicKeyTemplate->type;
                (&local_338.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type)[CVar14 * 3]._vptr_SecureAllocator = pp_Var2;
              }
              if (0x1c < local_4f8) break;
              pPublicKeyTemplate = pPublicKeyTemplate + 1;
              bVar19 = uVar11 < local_4f8;
              uVar11 = uVar11 + 1;
              CVar14 = CVar13;
            } while (bVar19);
            CVar17 = CreateObject(this,local_500,(CK_ATTRIBUTE_PTR)&local_338,CVar13,phPublicKey,4);
            if (CVar17 == 0) {
              plVar9 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
              CVar17 = 6;
              if (((plVar9 != (long *)0x0) &&
                  (cVar3 = (**(code **)(*plVar9 + 0x50))(plVar9), cVar3 != '\0')) &&
                 (cVar3 = (**(code **)(*plVar9 + 0x58))(plVar9,1), cVar3 != '\0')) {
                OSAttribute::OSAttribute(&local_5a8,true);
                cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x163,&local_5a8);
                OSAttribute::~OSAttribute(&local_5a8);
                if (cVar3 == '\0') {
                  cVar3 = '\0';
                  plVar15 = local_508;
                }
                else {
                  OSAttribute::OSAttribute(&local_5a8,0);
                  plVar15 = local_508;
                  cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x166,&local_5a8);
                  OSAttribute::~OSAttribute(&local_5a8);
                }
                ByteString::ByteString(&local_4c8);
                ByteString::ByteString(&local_4f0);
                if (isPublicKeyPrivate == '\0') {
                  pBVar12 = (ByteString *)(**(code **)(*plVar15 + 0x40))(plVar15);
                  ByteString::operator=(&local_4c8,pBVar12);
                  pBVar12 = (ByteString *)(**(code **)(*plVar15 + 0x48))(plVar15);
                  ByteString::operator=(&local_4f0,pBVar12);
                }
                else {
                  pcVar10 = (char *)(**(code **)(*plVar15 + 0x40))(plVar15);
                  Token::encrypt(this_01,pcVar10,(int)&local_4c8);
                  pcVar10 = (char *)(**(code **)(*plVar15 + 0x48))(plVar15);
                  Token::encrypt(this_01,pcVar10,(int)&local_4f0);
                }
                if (cVar3 != '\0') {
                  OSAttribute::OSAttribute(&local_5a8,&local_4c8);
                  cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x120,&local_5a8);
                  OSAttribute::~OSAttribute(&local_5a8);
                  if (cVar3 != '\0') {
                    OSAttribute::OSAttribute(&local_5a8,&local_4f0);
                    cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x122,&local_5a8);
                    OSAttribute::~OSAttribute(&local_5a8);
                    if (cVar3 != '\0') {
                      cVar3 = (**(code **)(*plVar9 + 0x60))(plVar9);
                      local_4f0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                      ~_Vector_base(&local_4f0.byteString.
                                     super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   );
                      local_4c8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                      ~_Vector_base(&local_4c8.byteString.
                                     super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                   );
                      if (cVar3 != '\0') {
                        local_3a8._8_8_ = (_func_int **)0x3;
                        local_3a8._0_8_ = (_func_int **)0x0;
                        memset(&local_338,0,0x300);
                        local_338.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)0x8;
                        local_338.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)0x1;
                        local_338.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = &isPrivateKeyOnToken;
                        local_310 = 1;
                        local_308 = 2;
                        local_300 = &isPrivateKeyPrivate;
                        local_2f8 = 1;
                        local_2f0 = 0x100;
                        local_2e0 = 8;
                        local_338.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                        super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)(local_3a8 + 8);
                        local_2e8 = (ByteString *)local_3a8;
                        if (local_5b0 - 1 < 0x1c) {
                          uVar11 = 1;
                          CVar13 = 4;
                          p_Var16 = local_4a0;
                          do {
                            CVar14 = CVar13;
                            if ((2 < p_Var16->type) && (p_Var16->type != 0x100)) {
                              CVar14 = CVar13 + 1;
                              (&local_338.byteString.
                                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data)[CVar13]._M_start =
                                   (pointer)p_Var16->ulValueLen;
                              pp_Var2 = (_func_int **)p_Var16->pValue;
                              (&local_338._vptr_ByteString)[CVar13 * 3] =
                                   (_func_int **)p_Var16->type;
                              (&local_338.byteString.
                                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
                                _M_impl.super__Tp_alloc_type)[CVar13 * 3]._vptr_SecureAllocator =
                                   pp_Var2;
                            }
                            if (0x1c < local_5b0) break;
                            p_Var16 = p_Var16 + 1;
                            bVar19 = uVar11 < local_5b0;
                            uVar11 = uVar11 + 1;
                            CVar13 = CVar14;
                          } while (bVar19);
                        }
                        else {
                          CVar17 = 0xd1;
                          CVar14 = 4;
                          if (0x1c < local_5b0) goto LAB_0013beae;
                        }
                        CVar17 = CreateObject(this,local_500,(CK_ATTRIBUTE_PTR)&local_338,CVar14,
                                              phPrivateKey,4);
                        if (CVar17 == 0) {
                          plVar9 = (long *)HandleManager::getObject
                                                     (this->handleManager,*phPrivateKey);
                          CVar17 = 6;
                          if (((plVar9 != (long *)0x0) &&
                              (cVar3 = (**(code **)(*plVar9 + 0x50))(plVar9), cVar3 != '\0')) &&
                             (cVar3 = (**(code **)(*plVar9 + 0x58))(plVar9,1), cVar3 != '\0')) {
                            OSAttribute::OSAttribute(&local_5a8,true);
                            cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x163,&local_5a8);
                            OSAttribute::~OSAttribute(&local_5a8);
                            if (cVar3 == '\0') {
                              cVar3 = '\0';
                            }
                            else {
                              OSAttribute::OSAttribute(&local_5a8,0);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x166,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                            }
                            bVar19 = (bool)(**(code **)(*plVar9 + 0x20))(plVar9,0x103,0);
                            if (cVar3 == '\0') {
                              cVar3 = '\0';
                            }
                            else {
                              OSAttribute::OSAttribute(&local_5a8,bVar19);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x165,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                            }
                            bVar4 = (**(code **)(*plVar9 + 0x20))(plVar9,0x162,0);
                            if (cVar3 == '\0') {
                              cVar3 = '\0';
                            }
                            else {
                              OSAttribute::OSAttribute(&local_5a8,(bool)(bVar4 ^ 1));
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x164,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                            }
                            ByteString::ByteString(&local_4c8);
                            ByteString::ByteString(&local_4f0);
                            ByteString::ByteString(&local_470);
                            ByteString::ByteString(&local_498);
                            ByteString::ByteString(&local_3d0);
                            ByteString::ByteString(&local_3f8);
                            ByteString::ByteString(&local_420);
                            ByteString::ByteString(&local_448);
                            if (isPrivateKeyPrivate == '\0') {
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0xb0))(plVar7);
                              ByteString::operator=(&local_4c8,pBVar12);
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0xb8))();
                              ByteString::operator=(&local_4f0,pBVar12);
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0xa8))();
                              ByteString::operator=(&local_470,pBVar12);
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0x80))();
                              ByteString::operator=(&local_498,pBVar12);
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0x88))();
                              ByteString::operator=(&local_3d0,pBVar12);
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0x98))();
                              ByteString::operator=(&local_3f8,pBVar12);
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0xa0))();
                              ByteString::operator=(&local_420,pBVar12);
                              pBVar12 = (ByteString *)(**(code **)(*plVar7 + 0x90))();
                              ByteString::operator=(&local_448,pBVar12);
                            }
                            else {
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0xb0))(plVar7);
                              Token::encrypt(this_01,pcVar10,(int)&local_4c8);
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0xb8))();
                              Token::encrypt(this_01,pcVar10,(int)&local_4f0);
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0xa8))();
                              Token::encrypt(this_01,pcVar10,(int)&local_470);
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0x80))();
                              Token::encrypt(this_01,pcVar10,(int)&local_498);
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0x88))();
                              Token::encrypt(this_01,pcVar10,(int)&local_3d0);
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0x98))();
                              Token::encrypt(this_01,pcVar10,(int)&local_3f8);
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0xa0))();
                              Token::encrypt(this_01,pcVar10,(int)&local_420);
                              pcVar10 = (char *)(**(code **)(*plVar7 + 0x90))();
                              Token::encrypt(this_01,pcVar10,(int)&local_448);
                            }
                            if (cVar3 == '\0') {
LAB_0013c98b:
                              (**(code **)(*plVar9 + 0x68))(plVar9);
                              CVar17 = 6;
                            }
                            else {
                              OSAttribute::OSAttribute(&local_5a8,&local_4c8);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x120,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              OSAttribute::OSAttribute(&local_5a8,&local_4f0);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x122,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              OSAttribute::OSAttribute(&local_5a8,&local_470);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x123,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              OSAttribute::OSAttribute(&local_5a8,&local_498);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x124,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              OSAttribute::OSAttribute(&local_5a8,&local_3d0);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x125,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              OSAttribute::OSAttribute(&local_5a8,&local_3f8);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x126,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              OSAttribute::OSAttribute(&local_5a8,&local_420);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x127,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              OSAttribute::OSAttribute(&local_5a8,&local_448);
                              cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x128,&local_5a8);
                              OSAttribute::~OSAttribute(&local_5a8);
                              if (cVar3 == '\0') goto LAB_0013c98b;
                              cVar3 = (**(code **)(*plVar9 + 0x60))(plVar9);
                              CVar17 = 6;
                              if (cVar3 != '\0') {
                                CVar17 = 0;
                              }
                            }
                            local_448._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_448.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                            local_420._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_420.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                            local_3f8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_3f8.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                            local_3d0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_3d0.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                            local_498._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_498.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                            local_470._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_470.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                            local_4f0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_4f0.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                            local_4c8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                            ~_Vector_base(&local_4c8.byteString.
                                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                         );
                          }
                        }
                      }
                      goto LAB_0013beae;
                    }
                  }
                }
                (**(code **)(*plVar9 + 0x68))(plVar9);
                local_4f0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_4f0.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                local_4c8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_4c8.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
              }
            }
          }
LAB_0013beae:
          (**(code **)(*plVar8 + 0xc0))(plVar8,local_5b8);
          pCVar6 = CryptoFactory::i();
          (*pCVar6->_vptr_CryptoFactory[3])(pCVar6,plVar8);
          if (CVar17 == 0) {
            CVar17 = 0;
          }
          else {
            if (*phPrivateKey != 0) {
              plVar8 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
              HandleManager::destroyObject(this->handleManager,*phPrivateKey);
              if (plVar8 != (long *)0x0) {
                (**(code **)(*plVar8 + 0x70))(plVar8);
              }
              *phPrivateKey = 0;
            }
            if (*phPublicKey != 0) {
              plVar8 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
              HandleManager::destroyObject(this->handleManager,*phPublicKey);
              if (plVar8 != (long *)0x0) {
                (**(code **)(*plVar8 + 0x70))(plVar8);
              }
              *phPublicKey = 0;
            }
          }
        }
      }
      local_370.super_AsymmetricParameters.super_Serialisable._vptr_Serialisable =
           (Serialisable)&PTR_serialise_0019bb30;
      local_370.e._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_370.e.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      goto LAB_0013c041;
    }
  }
  CVar17 = 0xd0;
  softHSMLog(6,"generateRSA",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
             ,0x20ed,"Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
LAB_0013c041:
  local_398._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_398.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar17;
}

Assistant:

CK_RV SoftHSM::generateRSA
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate
)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information: bitlen and public exponent
	size_t bitLen = 0;
	ByteString exponent("010001");
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_MODULUS_BITS:
				if (pPublicKeyTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_MODULUS_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pPublicKeyTemplate[i].pValue;
				break;
			case CKA_PUBLIC_EXPONENT:
				exponent = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// CKA_MODULUS_BITS must be specified to be able to generate a key pair.
	if (bitLen == 0) {
		INFO_MSG("Missing CKA_MODULUS_BITS in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	RSAParameters p;
	p.setE(exponent);
	p.setBitLength(bitLen);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* rsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
	if (rsa == NULL)
		return CKR_GENERAL_ERROR;
	if (!rsa->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);
		return CKR_GENERAL_ERROR;
	}

	RSAPublicKey* pub = (RSAPublicKey*) kp->getPublicKey();
	RSAPrivateKey* priv = (RSAPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_RSA;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
				case CKA_PUBLIC_EXPONENT:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// RSA Public Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getN(), modulus);
					token->encrypt(pub->getE(), publicExponent);
				}
				else
				{
					modulus = pub->getN();
					publicExponent = pub->getE();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_RSA;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_RSA_PKCS_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// RSA Private Key Attributes
				ByteString modulus;
				ByteString publicExponent;
				ByteString privateExponent;
				ByteString prime1;
				ByteString prime2;
				ByteString exponent1;
				ByteString exponent2;
				ByteString coefficient;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getN(), modulus);
					token->encrypt(priv->getE(), publicExponent);
					token->encrypt(priv->getD(), privateExponent);
					token->encrypt(priv->getP(), prime1);
					token->encrypt(priv->getQ(), prime2);
					token->encrypt(priv->getDP1(), exponent1);
					token->encrypt(priv->getDQ1(), exponent2);
					token->encrypt(priv->getPQ(), coefficient);
				}
				else
				{
					modulus = priv->getN();
					publicExponent = priv->getE();
					privateExponent = priv->getD();
					prime1 = priv->getP();
					prime2 = priv->getQ();
					exponent1 =  priv->getDP1();
					exponent2 = priv->getDQ1();
					coefficient = priv->getPQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_MODULUS, modulus);
				bOK = bOK && osobject->setAttribute(CKA_PUBLIC_EXPONENT, publicExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIVATE_EXPONENT, privateExponent);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_1, prime1);
				bOK = bOK && osobject->setAttribute(CKA_PRIME_2, prime2);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_1,exponent1);
				bOK = bOK && osobject->setAttribute(CKA_EXPONENT_2, exponent2);
				bOK = bOK && osobject->setAttribute(CKA_COEFFICIENT, coefficient);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	rsa->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(rsa);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}